

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

TcpSocket * __thiscall TcpServerImpl::MakeClientConnection(TcpServerImpl *this,int32_t *fSock)

{
  BaseSocket *pBVar1;
  TcpSocketImpl *pTVar2;
  pointer pBVar3;
  BaseSocketImpl *pBVar4;
  TcpSocketImpl *local_b8;
  TcpServer *local_a8;
  TcpSocketImpl *local_98;
  TcpSocketImpl *local_88;
  lock_guard<std::mutex> local_70;
  lock_guard<std::mutex> lock;
  int iErrNo;
  TcpSocketImpl *local_58;
  code *local_50;
  undefined8 local_48;
  thread local_40;
  TcpSocketImpl *local_38;
  TcpSocketImpl *pTcpSocketImpl;
  TcpSocket *pTcpSock;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> local_20;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> pTcpSocket;
  int32_t *fSock_local;
  TcpServerImpl *this_local;
  
  pTcpSocket._M_t.super___uniq_ptr_impl<BaseSocket,_std::default_delete<BaseSocket>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
  super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl =
       (__uniq_ptr_data<BaseSocket,_std::default_delete<BaseSocket>,_true,_true>)
       (__uniq_ptr_data<BaseSocket,_std::default_delete<BaseSocket>,_true,_true>)fSock;
  std::make_unique<TcpSocket>();
  std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>::
  unique_ptr<TcpSocket,std::default_delete<TcpSocket>,void>
            ((unique_ptr<BaseSocket,std::default_delete<BaseSocket>> *)&local_20,
             (unique_ptr<TcpSocket,_std::default_delete<TcpSocket>_> *)&pTcpSock);
  std::unique_ptr<TcpSocket,_std::default_delete<TcpSocket>_>::~unique_ptr
            ((unique_ptr<TcpSocket,_std::default_delete<TcpSocket>_> *)&pTcpSock);
  pBVar3 = std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>::get(&local_20);
  if (pBVar3 == (pointer)0x0) {
    local_88 = (TcpSocketImpl *)0x0;
  }
  else {
    local_88 = (TcpSocketImpl *)__dynamic_cast(pBVar3,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
  }
  pTcpSocketImpl = local_88;
  pBVar4 = BaseSocket::GetImpl((BaseSocket *)local_88);
  if (pBVar4 == (BaseSocketImpl *)0x0) {
    local_98 = (TcpSocketImpl *)0x0;
  }
  else {
    local_98 = (TcpSocketImpl *)
               __dynamic_cast(pBVar4,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  local_38 = local_98;
  (local_98->super_BaseSocketImpl).m_fSock =
       *(int32_t *)
        pTcpSocket._M_t.super___uniq_ptr_impl<BaseSocket,_std::default_delete<BaseSocket>_>._M_t.
        super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
        super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl;
  std::__atomic_base<unsigned_char>::operator=
            (&(local_98->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>,
             '\a');
  pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    local_a8 = (TcpServer *)0x0;
  }
  else {
    local_a8 = (TcpServer *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpServer::typeinfo,0);
  }
  local_38->m_pRefServSocket = local_a8;
  local_50 = TcpSocketImpl::WriteThread;
  local_48 = 0;
  pBVar4 = BaseSocket::GetImpl((BaseSocket *)pTcpSocketImpl);
  if (pBVar4 == (BaseSocketImpl *)0x0) {
    local_b8 = (TcpSocketImpl *)0x0;
  }
  else {
    local_b8 = (TcpSocketImpl *)
               __dynamic_cast(pBVar4,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  local_58 = local_b8;
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_40,(type *)&local_50,&local_58);
  std::thread::operator=(&(local_38->super_BaseSocketImpl).m_thWrite,&local_40);
  std::thread::~thread(&local_40);
  (*(local_38->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])
            (local_38,pTcpSocket._M_t.
                      super___uniq_ptr_impl<BaseSocket,_std::default_delete<BaseSocket>_>._M_t.
                      super__Tuple_impl<0UL,_BaseSocket_*,_std::default_delete<BaseSocket>_>.
                      super__Head_base<0UL,_BaseSocket_*,_false>._M_head_impl);
  TcpSocketImpl::GetConnectionInfo(local_38);
  std::lock_guard<std::mutex>::lock_guard(&local_70,&BaseSocketImpl::s_mxClientSocket);
  std::
  deque<std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>,_std::allocator<std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>_>_>
  ::push_back(&BaseSocketImpl::s_lstClientSocket,&local_20);
  pTVar2 = pTcpSocketImpl;
  std::lock_guard<std::mutex>::~lock_guard(&local_70);
  std::unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_>::~unique_ptr(&local_20);
  return (TcpSocket *)pTVar2;
}

Assistant:

TcpSocket* TcpServerImpl::MakeClientConnection(const SOCKET& fSock)
{
    unique_ptr<BaseSocket> pTcpSocket = make_unique<TcpSocket>();
    TcpSocket* pTcpSock = dynamic_cast<TcpSocket*>(pTcpSocket.get());
    TcpSocketImpl* pTcpSocketImpl = dynamic_cast<TcpSocketImpl*>(pTcpSock->GetImpl());

    try
    {
        pTcpSocketImpl->m_fSock = fSock;
        pTcpSocketImpl->m_iShutDownState = 7;
        pTcpSocketImpl->m_pRefServSocket = dynamic_cast<TcpServer*>(m_pBkRef);
        pTcpSocketImpl->m_thWrite = thread(&TcpSocketImpl::WriteThread, dynamic_cast<TcpSocketImpl*>(pTcpSock->GetImpl()));

        pTcpSocketImpl->SetSocketOption(fSock);
        pTcpSocketImpl->GetConnectionInfo();
    }

    catch (const int iErrNo)
    {
        pTcpSocketImpl->SetErrorNo(iErrNo);
    }

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pTcpSocket));

    return pTcpSock;
}